

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerfGroup.cpp
# Opt level: O0

ssize_t __thiscall PerfGroup::read(PerfGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  int __fd_00;
  bool bVar1;
  unsigned_long uVar2;
  reference piVar3;
  uchar *__buf_00;
  iterator iVar4;
  iterator iVar5;
  pointer pDVar6;
  ostream *this_00;
  ssize_t extraout_RAX;
  ssize_t sVar7;
  __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
  it;
  uint64_t value;
  uint64_t id;
  uint64_t i;
  Message *msg;
  ssize_t nb;
  int lead;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t bufsize;
  Descriptor *d;
  iterator __end1;
  iterator __begin1;
  vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_> *__range1;
  size_t n;
  vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_> *in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
  local_b8;
  allocator_type *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong *local_98;
  ssize_t local_90;
  int local_84;
  int *local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  PerfGroup *local_70;
  ulong local_38;
  reference local_30;
  Descriptor *local_28;
  __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
  local_20;
  vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_> *local_18;
  size_type local_10;
  PerfGroup *local_8;
  
  local_8 = this;
  local_10 = std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::size
                       (&this->_ids);
  if (local_10 == 0) {
    sVar7 = 0;
  }
  else {
    local_18 = &this->_ids;
    local_20._M_current =
         (Descriptor *)
         std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::begin
                   (in_stack_fffffffffffffec8);
    local_28 = (Descriptor *)
               std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::end
                         (in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                 ::operator*(&local_20);
      uVar2 = std::numeric_limits<unsigned_long>::max();
      local_30->value = uVar2;
      __gnu_cxx::
      __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
      ::operator++(&local_20);
    }
    local_38 = local_10 << 5 | 0x10;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x127672);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x127698);
    local_70 = this;
    local_78._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
    local_80 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffed0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffec8), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_78);
      __fd_00 = *piVar3;
      local_84 = __fd_00;
      __buf_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12771b);
      local_90 = ::read(__fd_00,__buf_00,local_38);
      local_98 = (ulong *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     0x127750);
      for (local_a0 = 0; local_a0 < *local_98; local_a0 = local_a0 + 1) {
        local_a8 = local_98[local_a0 * 2 + 2];
        local_b0 = (allocator_type *)local_98[local_a0 * 2 + 1];
        iVar4 = std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::begin
                          (in_stack_fffffffffffffec8);
        iVar5 = std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::end
                          (in_stack_fffffffffffffec8);
        local_b8 = std::
                   lower_bound<__gnu_cxx::__normal_iterator<PerfGroup::Descriptor*,std::vector<PerfGroup::Descriptor,std::allocator<PerfGroup::Descriptor>>>,unsigned_long,PerfGroup::read()::__0>
                             (iVar4._M_current,iVar5._M_current,&local_a8);
        std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>::end
                  (in_stack_fffffffffffffec8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                            *)in_stack_fffffffffffffed0,
                           (__normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                            *)in_stack_fffffffffffffec8);
        if (bVar1) {
          uVar8 = local_a8;
          pDVar6 = __gnu_cxx::
                   __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                   ::operator->(&local_b8);
          if (uVar8 == pDVar6->id) {
            in_stack_fffffffffffffee0 = local_b0;
            pDVar6 = __gnu_cxx::
                     __normal_iterator<PerfGroup::Descriptor_*,_std::vector<PerfGroup::Descriptor,_std::allocator<PerfGroup::Descriptor>_>_>
                     ::operator->(&local_b8);
            pDVar6->value = (uint64_t)in_stack_fffffffffffffee0;
          }
        }
        else {
          this_00 = std::operator<<((ostream *)&std::cerr,"Not found id ");
          in_stack_fffffffffffffed0 = (ostream *)std::ostream::operator<<(this_00,local_a8);
          std::operator<<(in_stack_fffffffffffffed0,"\n");
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_78);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee0);
    sVar7 = extraout_RAX;
  }
  return sVar7;
}

Assistant:

void PerfGroup::read() {
    size_t n = _ids.size();
    if (n == 0) return;
    struct MessageValue {
        uint64_t value;
        uint64_t id;
    };
    struct Message {
        uint64_t nr;
        MessageValue values[];
    };
    for (Descriptor &d : _ids) d.value = std::numeric_limits<uint64_t>::max();
    size_t bufsize = 2 * (sizeof(Message) + n * sizeof(MessageValue));
    std::vector<uint8_t> buf(bufsize);
    for (int lead : _leaders) {
        ssize_t nb = ::read(lead, buf.data(), bufsize);
        Message *msg = (Message *)buf.data();
        for (uint64_t i = 0; i < msg->nr; i++) {
            uint64_t id = msg->values[i].id;
            uint64_t value = msg->values[i].value;
            // std::cerr << "Read lead:" << lead << " index " << id << "/" << msg->nr << "
            // value " << value << "\n";
            auto it = std::lower_bound(
                _ids.begin(), _ids.end(), id,
                [](const Descriptor &d, size_t id) { return d.id < id; });
            if (it != _ids.end()) {
                if (id == it->id) {
                    it->value = value;
                }
            } else {
                std::cerr << "Not found id " << id << "\n";
            }
        }
    }
}